

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QVariant * parseHeaderValue(KnownHeaders header,QByteArrayView value)

{
  QByteArrayView raw;
  QByteArrayView raw_00;
  QByteArrayView raw_01;
  QByteArrayView raw_02;
  bool bVar1;
  uint uVar2;
  qlonglong qVar3;
  ParsingMode in_EDX;
  undefined4 in_ESI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  qint64 result;
  QUrl result_1;
  bool ok;
  int in_stack_fffffffffffffe6c;
  byte bVar5;
  QByteArrayView *pQVar6;
  undefined8 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  storage_type *in_stack_fffffffffffffea8;
  QByteArrayView in_stack_fffffffffffffec0;
  undefined1 local_f8 [40];
  QByteArrayView in_stack_ffffffffffffff30;
  qsizetype in_stack_ffffffffffffff50;
  storage_type *in_stack_ffffffffffffff58;
  QUrl local_70 [3];
  QByteArrayView local_58;
  byte local_41;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
  case 6:
  case 7:
  case 8:
    pQVar6 = in_RDI;
    QString::fromLatin1((QByteArrayView *)local_30);
    QVariant::QVariant((QVariant *)in_RDI,(QString *)local_30);
    QString::~QString((QString *)0x1f4983);
    in_RDI = pQVar6;
    break;
  case 1:
    local_41 = 0xaa;
    pQVar6 = in_RDI;
    local_58 = QByteArrayView::trimmed(in_RDI);
    qVar3 = QByteArrayView::toLongLong(pQVar6,(bool *)in_RDI,in_stack_fffffffffffffe6c);
    if ((local_41 & 1) == 0) {
      QVariant::QVariant((QVariant *)0x1f4a14);
      in_RDI = pQVar6;
    }
    else {
      QVariant::QVariant((QVariant *)in_RDI,qVar3);
      in_RDI = pQVar6;
    }
    break;
  case 2:
    local_70[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
    pQVar6 = in_RDI;
    QUrl::fromEncoded((QByteArrayView *)local_70,in_EDX);
    uVar2 = QUrl::isValid();
    bVar4 = (uVar2 & 1) != 0;
    bVar5 = 0;
    if (bVar4) {
      QUrl::scheme();
      bVar1 = QString::isEmpty((QString *)0x1f4ab2);
      bVar5 = bVar1 ^ 0xff;
    }
    uVar2 = (uint)CONCAT11(bVar5,bVar5) << 0x10;
    if (bVar4) {
      QString::~QString((QString *)0x1f4ad6);
    }
    if ((uVar2 & 0x10000) == 0) {
      QVariant::QVariant((QVariant *)0x1f4b06);
    }
    else {
      QVariant::QVariant((QVariant *)in_RDI,(QUrl *)local_70);
    }
    QUrl::~QUrl(local_70);
    in_RDI = pQVar6;
    break;
  case 3:
  case 9:
    raw_01.m_data = in_stack_fffffffffffffea8;
    raw_01.m_size = (qsizetype)in_RDI;
    parseHttpDate(raw_01);
    break;
  case 4:
    raw_02.m_data = in_stack_ffffffffffffff58;
    raw_02.m_size = in_stack_ffffffffffffff50;
    parseCookieHeader(raw_02);
    QVariant::fromValue<QList<QNetworkCookie>,_true>((QList<QNetworkCookie> *)in_RDI);
    QList<QNetworkCookie>::~QList((QList<QNetworkCookie> *)0x1f4ca7);
    break;
  case 5:
    QNetworkCookie::parseCookies(in_stack_ffffffffffffff30);
    QVariant::fromValue<QList<QNetworkCookie>,_true>((QList<QNetworkCookie> *)in_RDI);
    QList<QNetworkCookie>::~QList((QList<QNetworkCookie> *)0x1f4cf0);
    break;
  case 10:
    parseETag(in_stack_fffffffffffffec0);
    break;
  case 0xb:
    raw.m_data._0_4_ = in_stack_fffffffffffffe98;
    raw.m_size = in_stack_fffffffffffffe90;
    raw.m_data._4_4_ = in_ESI;
    pQVar6 = in_RDI;
    parseIfMatch(raw);
    QVariant::QVariant((QVariant *)in_RDI,(QList_conflict1 *)&stack0xffffffffffffff30);
    QList<QString>::~QList((QList<QString> *)0x1f4bfa);
    in_RDI = pQVar6;
    break;
  case 0xc:
    raw_00.m_data._0_4_ = in_stack_fffffffffffffe98;
    raw_00.m_size = in_stack_fffffffffffffe90;
    raw_00.m_data._4_4_ = in_ESI;
    pQVar6 = in_RDI;
    parseIfNoneMatch(raw_00);
    QVariant::QVariant((QVariant *)in_RDI,(QList_conflict1 *)local_f8);
    QList<QString>::~QList((QList<QString> *)0x1f4c5b);
    in_RDI = pQVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

static QVariant parseHeaderValue(QNetworkRequest::KnownHeaders header, QByteArrayView value)
{
    // header is always a valid value
    switch (header) {
    case QNetworkRequest::UserAgentHeader:
    case QNetworkRequest::ServerHeader:
    case QNetworkRequest::ContentTypeHeader:
    case QNetworkRequest::ContentDispositionHeader:
        // copy exactly, convert to QString
        return QString::fromLatin1(value);

    case QNetworkRequest::ContentLengthHeader: {
        bool ok;
        qint64 result = QByteArrayView(value).trimmed().toLongLong(&ok);
        if (ok)
            return result;
        return QVariant();
    }

    case QNetworkRequest::LocationHeader: {
        QUrl result = QUrl::fromEncoded(value, QUrl::StrictMode);
        if (result.isValid() && !result.scheme().isEmpty())
            return result;
        return QVariant();
    }

    case QNetworkRequest::LastModifiedHeader:
    case QNetworkRequest::IfModifiedSinceHeader:
        return parseHttpDate(value);

    case QNetworkRequest::ETagHeader:
        return parseETag(value);

    case QNetworkRequest::IfMatchHeader:
        return parseIfMatch(value);

    case QNetworkRequest::IfNoneMatchHeader:
        return parseIfNoneMatch(value);

    case QNetworkRequest::CookieHeader:
        return QVariant::fromValue(parseCookieHeader(value));

    case QNetworkRequest::SetCookieHeader:
        return QVariant::fromValue(QNetworkCookie::parseCookies(value));

    default:
        Q_UNREACHABLE_RETURN({});
    }
}